

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void wabt::WriteLimitsData(Stream *stream,Limits *limits)

{
  Limits *limits_local;
  Stream *stream_local;
  
  if ((limits->is_64 & 1U) == 0) {
    WriteU32Leb128<unsigned_long>(stream,limits->initial,"limits: initial");
    if ((limits->has_max & 1U) != 0) {
      WriteU32Leb128<unsigned_long>(stream,limits->max,"limits: max");
    }
  }
  else {
    WriteU64Leb128(stream,limits->initial,"limits: initial");
    if ((limits->has_max & 1U) != 0) {
      WriteU64Leb128(stream,limits->max,"limits: max");
    }
  }
  return;
}

Assistant:

void WriteLimitsData(Stream* stream, const Limits* limits) {
  if (limits->is_64) {
    WriteU64Leb128(stream, limits->initial, "limits: initial");
    if (limits->has_max) {
      WriteU64Leb128(stream, limits->max, "limits: max");
    }
  } else {
    WriteU32Leb128(stream, limits->initial, "limits: initial");
    if (limits->has_max) {
      WriteU32Leb128(stream, limits->max, "limits: max");
    }
  }
}